

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.c
# Opt level: O2

void unit_less(void)

{
  if (UnitsOn != '\x01') {
    return;
  }
  if (unitonflag == 0) {
    if ((unit *)((long)&usp + 7U) < usp) {
      usp = usp + -1;
      return;
    }
    __assert_fail("usp >= unit_stack",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BlueBrain[P]mod2c/src/mod2c_core/units.c"
                  ,0x96,"void unit_pop()");
  }
  dimensionless();
  if ((usp->dim[0] != '\t') && (1e-05 < ABS(1.0 / usp->factor + -1.0))) {
    fprintf(_stderr,"The previous expression needs the conversion factor (%g)\n");
    diag("",(char *)0x0);
  }
  unit_pop();
  return;
}

Assistant:

void unit_less() {
	/* ensures top element is dimensionless  with factor 1*/
	IFUNITS
	if (unitonflag) {
		dimensionless();
		if (usp->dim[0]!=9 && OUTTOLERANCE(usp->factor,1.0)) {
fprintf(stderr, "The previous expression needs the conversion factor (%g)\n",
1./(usp->factor));
			diag("", (char *)0);
		}
	}
	unit_pop();
}